

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void main_loop(tgestate_t *state)

{
  tgestate_t *in_RDI;
  tgestate_t *in_stack_00000010;
  tgestate_t *in_stack_00000020;
  tgestate_t *in_stack_00000030;
  tgestate_t *in_stack_00000040;
  tgestate_t *in_stack_00000060;
  tgestate_t *in_stack_00000070;
  
  (*in_RDI->speccy->stamp)(in_RDI->speccy);
  check_morale((tgestate_t *)0x109154);
  keyscan_break(state);
  message_display(in_stack_00000010);
  process_player_input(state);
  in_permitted_area(in_stack_00000030);
  restore_tiles(in_stack_00000060);
  move_a_character(in_stack_00000040);
  automatics(in_stack_00000010);
  purge_invisible_characters(in_stack_00000020);
  spawn_characters(in_stack_00000020);
  mark_nearby_items(in_RDI);
  ring_bell(state);
  animate(in_stack_00000070);
  move_map(in_stack_00000010);
  message_display(in_stack_00000010);
  ring_bell(state);
  plot_sprites(in_stack_00000010);
  plot_game_window(in_stack_00000030);
  ring_bell(state);
  if (in_RDI->day_or_night != '\0') {
    nighttime(in_stack_00000010);
  }
  wave_morale_flag(in_stack_00000020);
  if ((in_RDI->game_counter & 0x3f) == 0) {
    dispatch_timed_event(in_stack_00000010);
  }
  (*in_RDI->speccy->sleep)(in_RDI->speccy,0x59c73);
  return;
}

Assistant:

void main_loop(tgestate_t *state)
{
  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  check_morale(state);
  keyscan_break(state);
  message_display(state);
  process_player_input(state);
  in_permitted_area(state);
  restore_tiles(state);
  move_a_character(state);
  automatics(state);
  purge_invisible_characters(state);
  spawn_characters(state);
  mark_nearby_items(state);
  ring_bell(state);
  animate(state);
  move_map(state);
  message_display(state); /* second */
  ring_bell(state); /* second */
  plot_sprites(state);
  plot_game_window(state);
  ring_bell(state); /* third */
  if (state->day_or_night != 0)
    nighttime(state);
  /* Conv: Removed interior_delay_loop call here. */
  wave_morale_flag(state);
  if ((state->game_counter & 63) == 0)
    dispatch_timed_event(state);

  /* Conv: Timing: To calculate the magic timing interval value here the
   * original game was run in FUSE and its main_loop breakpointed. For both
   * indoor and outdoor scenes the T-states and current frame number were
   * captured, then the average T-state figure for the game was calculated.
   *
   * The original game is not dependent on accurate timing: it is much slower
   * in outdoor scenes and especially when multiple characters are on the
   * screen simultaneously. */
  (void) state->speccy->sleep(state->speccy, 367731);
}